

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

Availability __thiscall
Satisfier<XOnlyPubKey>::SatRIPEMD160
          (Satisfier<XOnlyPubKey> *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *hash,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *preimage)

{
  long lVar1;
  SignatureData *pSVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = this->m_sig_data;
  cVar3 = std::
          _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&(pSVar2->ripemd160_preimages)._M_t,hash);
  bVar4 = (_Rb_tree_header *)cVar3._M_node !=
          &(pSVar2->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header;
  if (bVar4) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (preimage,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &cVar3._M_node[1]._M_right);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (uint)bVar4;
}

Assistant:

miniscript::Availability SatRIPEMD160(const std::vector<unsigned char>& hash, std::vector<unsigned char>& preimage) const {
        return MsLookupHelper(m_sig_data.ripemd160_preimages, hash, preimage);
    }